

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

int __thiscall QCss::Parser::init(Parser *this,EVP_PKEY_CTX *ctx)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int *piVar4;
  QDebug QVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Data *pDVar8;
  char cVar9;
  char in_DL;
  undefined8 *puVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QFileInfo local_c0 [8];
  QDebug local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined1 *local_98;
  undefined1 *puStack_90;
  QString local_88;
  QString local_68;
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.d.d = *(Data **)ctx;
  local_88.d.ptr = *(char16_t **)(ctx + 8);
  local_88.d.size = *(qsizetype *)(ctx + 0x10);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (in_DL == '\0') {
    if ((this->sourcePath).d.ptr != (char16_t *)0x0) {
      pQVar1 = &((this->sourcePath).d.d)->super_QArrayData;
      (this->sourcePath).d.d = (Data *)0x0;
      (this->sourcePath).d.ptr = (char16_t *)0x0;
      (this->sourcePath).d.size = 0;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
    }
  }
  else {
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_98,(QString *)ctx);
    cVar9 = QFile::open((QFile *)&local_98,1);
    if (cVar9 == '\0') {
      local_48._0_4_ = 2;
      local_48._4_4_ = 0;
      local_48._8_4_ = 0;
      local_48._12_4_ = 0;
      local_48._16_4_ = 0;
      local_48._20_4_ = 0;
      local_48._24_8_ = "default";
      QMessageLogger::warning();
      QVar5.stream = local_b8.stream;
      QVar11.m_data = (storage_type *)0x23;
      QVar11.m_size = (qsizetype)&local_68;
      QString::fromUtf8(QVar11);
      QTextStream::operator<<(&(QVar5.stream)->ts,&local_68);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((local_b8.stream)->space == true) {
        QTextStream::operator<<(&(local_b8.stream)->ts,' ');
      }
      puVar10 = *(undefined8 **)(ctx + 8);
      if (puVar10 == (undefined8 *)0x0) {
        puVar10 = &QString::_empty;
      }
      QDebug::putString((QChar *)&local_b8,(ulong)puVar10);
      if ((local_b8.stream)->space == true) {
        QTextStream::operator<<(&(local_b8.stream)->ts,' ');
      }
      QDebug::~QDebug(&local_b8);
      pDVar8 = local_88.d.d;
      if (local_88.d.ptr != (char16_t *)0x0) {
        local_88.d.d = (Data *)0x0;
        local_88.d.ptr = (char16_t *)0x0;
        local_88.d.size = 0;
        if (&pDVar8->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
          }
        }
      }
    }
    else {
      QFileInfo::QFileInfo(local_c0,&local_88);
      QFileInfo::absolutePath();
      uVar7 = local_a8;
      uVar6 = uStack_b0;
      QVar5.stream = local_b8.stream;
      local_b8.stream = (Stream *)0x0;
      uStack_b0 = 0;
      local_48._0_4_ = SUB84(QVar5.stream,0);
      local_48._4_4_ = (undefined4)((ulong)QVar5.stream >> 0x20);
      local_48._8_4_ = (undefined4)uVar6;
      local_48._12_4_ = (undefined4)((ulong)uVar6 >> 0x20);
      local_a8 = 0;
      local_48._16_4_ = (undefined4)uVar7;
      local_48._20_4_ = (undefined4)((ulong)uVar7 >> 0x20);
      local_48._24_2_ = 0x2f;
      QStringBuilder<QString,_char16_t>::convertTo<QString>
                (&local_68,(QStringBuilder<QString,_char16_t> *)local_48);
      pQVar1 = &((this->sourcePath).d.d)->super_QArrayData;
      pcVar2 = (this->sourcePath).d.ptr;
      (this->sourcePath).d.d = local_68.d.d;
      (this->sourcePath).d.ptr = local_68.d.ptr;
      qVar3 = (this->sourcePath).d.size;
      (this->sourcePath).d.size = local_68.d.size;
      local_68.d.d = (Data *)pQVar1;
      local_68.d.ptr = pcVar2;
      local_68.d.size = qVar3;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
      piVar4 = (int *)CONCAT44(local_48._4_4_,local_48._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_48._4_4_,local_48._0_4_),2,0x10);
        }
      }
      if (local_b8.stream != (Stream *)0x0) {
        LOCK();
        *(int *)local_b8.stream = *(int *)local_b8.stream + -1;
        UNLOCK();
        if (*(int *)local_b8.stream == 0) {
          QArrayData::deallocate((QArrayData *)local_b8.stream,2,0x10);
        }
      }
      QFileInfo::~QFileInfo(local_c0);
      local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QTextStream::QTextStream((QTextStream *)&local_68,(QIODevice *)&local_98);
      QTextStream::readAll();
      pDVar8 = local_88.d.d;
      pQVar1 = (QArrayData *)CONCAT44(local_48._4_4_,local_48._0_4_);
      pcVar2 = (char16_t *)CONCAT44(local_48._12_4_,local_48._8_4_);
      local_48._0_4_ = SUB84(local_88.d.d,0);
      local_48._4_4_ = (undefined4)((ulong)local_88.d.d >> 0x20);
      qVar3 = CONCAT44(local_48._20_4_,local_48._16_4_);
      local_48._8_4_ = SUB84(local_88.d.ptr,0);
      local_48._12_4_ = (undefined4)((ulong)local_88.d.ptr >> 0x20);
      local_48._16_4_ = (undefined4)local_88.d.size;
      local_48._20_4_ = (undefined4)((ulong)local_88.d.size >> 0x20);
      local_88.d.ptr = pcVar2;
      local_88.d.size = qVar3;
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          local_88.d.d = (Data *)pQVar1;
          QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
          pQVar1 = &(local_88.d.d)->super_QArrayData;
        }
      }
      local_88.d.d = (Data *)pQVar1;
      QTextStream::~QTextStream((QTextStream *)&local_68);
    }
    QFile::~QFile((QFile *)&local_98);
  }
  this->hasEscapeSequences = false;
  QList<QCss::Symbol>::clear(&this->symbols);
  QList<QCss::Symbol>::reserve(&this->symbols,8);
  Scanner::preprocess((QString *)local_48,&local_88,&this->hasEscapeSequences);
  Scanner::scan((QString *)local_48,&this->symbols);
  piVar4 = (int *)CONCAT44(local_48._4_4_,local_48._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_48._4_4_,local_48._0_4_),2,0x10);
    }
  }
  this->index = 0;
  this->errorIndex = -1;
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void Parser::init(const QString &css, bool isFile)
{
    QString styleSheet = css;
    if (isFile) {
        QFile file(css);
        if (file.open(QFile::ReadOnly)) {
            sourcePath = QFileInfo(styleSheet).absolutePath() + u'/';
            QTextStream stream(&file);
            styleSheet = stream.readAll();
        } else {
            qWarning() << "QCss::Parser - Failed to load file " << css;
            styleSheet.clear();
        }
    } else {
        sourcePath.clear();
    }

    hasEscapeSequences = false;
    symbols.clear();
    symbols.reserve(8);
    Scanner::scan(Scanner::preprocess(styleSheet, &hasEscapeSequences), &symbols);
    index = 0;
    errorIndex = -1;
}